

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLEScanPartialInternal<duckdb::hugeint_t,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  bool bVar4;
  RLEScanState<duckdb::hugeint_t> *this;
  data_ptr_t pdVar5;
  idx_t iVar6;
  hugeint_t *phVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t in_RDX;
  ColumnSegment *in_RDI;
  ulong in_R8;
  idx_t i_1;
  idx_t i;
  hugeint_t element;
  idx_t remaining_scan_count;
  idx_t run_count;
  rle_count_t run_end;
  idx_t result_end;
  hugeint_t *result_data;
  rle_count_t *index_pointer;
  hugeint_t *data_pointer;
  data_ptr_t data;
  RLEScanState<duckdb::hugeint_t> *scan_state;
  Vector *in_stack_ffffffffffffff70;
  idx_t in_stack_ffffffffffffff78;
  hugeint_t *in_stack_ffffffffffffff80;
  rle_count_t *in_stack_ffffffffffffff88;
  RLEScanState<duckdb::hugeint_t> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  VectorType vector_type_p;
  undefined6 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa6;
  ulong local_28;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_ffffffffffffff70);
  this = SegmentScanState::Cast<duckdb::RLEScanState<duckdb::hugeint_t>>
                   ((SegmentScanState *)in_stack_ffffffffffffff70);
  pdVar5 = BufferHandle::Ptr((BufferHandle *)0xa54335);
  iVar6 = ColumnSegment::GetBlockOffset(in_RDI);
  lVar3 = this->rle_count_offset + iVar6;
  bVar4 = CanEmitConstantVector<true>
                    (this->position_in_entry,
                     (ulong)*(ushort *)(pdVar5 + this->entry_pos * 2 + lVar3),in_RDX);
  if (bVar4) {
    RLEScanConstant<duckdb::hugeint_t>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  else {
    phVar7 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xa543d8);
    Vector::SetVectorType
              ((Vector *)CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),vector_type_p
              );
    local_28 = in_R8;
    while (local_28 < in_R8 + in_RDX) {
      uVar8 = (ulong)*(ushort *)(pdVar5 + this->entry_pos * 2 + lVar3) - this->position_in_entry;
      uVar9 = (in_R8 + in_RDX) - local_28;
      uVar1 = *(uint64_t *)(pdVar5 + this->entry_pos * 0x10 + iVar6 + 8);
      uVar2 = *(uint64_t *)((long)(pdVar5 + this->entry_pos * 0x10 + iVar6 + 8) + 8);
      if (uVar9 < uVar8) {
        for (uVar8 = 0; uVar8 < uVar9; uVar8 = uVar8 + 1) {
          phVar7[local_28 + uVar8].lower = uVar1;
          phVar7[local_28 + uVar8].upper = uVar2;
        }
        this->position_in_entry = uVar9 + this->position_in_entry;
        return;
      }
      for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
        phVar7[local_28 + uVar9].lower = uVar1;
        phVar7[local_28 + uVar9].upper = uVar2;
      }
      local_28 = uVar8 + local_28;
      RLEScanState<duckdb::hugeint_t>::ForwardToNextRun(this);
    }
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}